

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::keyReleaseEvent(QAbstractButton *this,QKeyEvent *e)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QAbstractButtonPrivate *this_00;
  QPlatformTheme *pQVar4;
  QKeyEvent *in_RSI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QList<Qt::Key> buttonPressKeys;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffb8;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractButton *)0x500e5a);
  bVar1 = QKeyEvent::isAutoRepeat(in_RSI);
  if (!bVar1) {
    QBasicTimer::stop();
  }
  pQVar4 = QGuiApplicationPrivate::platformTheme();
  (**(code **)(*(long *)pQVar4 + 0x60))(&local_28,pQVar4,0x28);
  ::QVariant::value<QList<Qt::Key>>
            ((QVariant *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  ::QVariant::~QVariant(&local_28);
  iVar3 = QKeyEvent::key(in_RSI);
  bVar2 = QListSpecialMethodsBase<Qt::Key>::contains<int>
                    ((QListSpecialMethodsBase<Qt::Key> *)this_00,
                     (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  bVar1 = false;
  if (bVar2) {
    bVar2 = QKeyEvent::isAutoRepeat(in_RSI);
    bVar1 = false;
    if (!bVar2) {
      bVar1 = ((byte)this_00->field_0x28c >> 4 & 1) != 0;
    }
  }
  if (bVar1) {
    QAbstractButtonPrivate::click
              ((QAbstractButtonPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffb8));
  }
  else {
    QEvent::ignore((QEvent *)in_RSI);
  }
  QList<Qt::Key>::~QList((QList<Qt::Key> *)0x500f6d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QAbstractButton);

    if (!e->isAutoRepeat())
        d->repeatTimer.stop();

    const auto buttonPressKeys = QGuiApplicationPrivate::platformTheme()
                                         ->themeHint(QPlatformTheme::ButtonPressKeys)
                                         .value<QList<Qt::Key>>();
    if (buttonPressKeys.contains(e->key()) && !e->isAutoRepeat() && d->down) {
        d->click();
        return;
    }

    e->ignore();
}